

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O2

void chrono::utils::WriteBodies
               (ChSystem *system,string *filename,bool active_only,bool dump_vel,string *delim)

{
  int iVar1;
  CSV_writer *pCVar2;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<chrono::ChBody> body;
  CSV_writer csv;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_208;
  string *local_1f8;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *local_1f0;
  string local_1e8;
  CSV_writer local_1c8;
  
  local_1f8 = filename;
  CSV_writer::CSV_writer(&local_1c8,delim);
  p_Var3 = &((system->assembly).bodylist.
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
  p_Var4 = &((system->assembly).bodylist.
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
  local_1f0 = p_Var3;
  do {
    if (p_Var4 == p_Var3) {
      std::__cxx11::string::string((string *)&local_1e8,"",(allocator *)&local_208);
      CSV_writer::write_to_file(&local_1c8,local_1f8,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      CSV_writer::~CSV_writer(&local_1c8);
      return;
    }
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_208,p_Var4);
    if (active_only) {
      iVar1 = (*((local_208._M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
      if ((char)iVar1 != '\0') goto LAB_00e3aeec;
    }
    else {
LAB_00e3aeec:
      pCVar2 = operator<<(&local_1c8,
                          &((local_208._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>.
                           super_ChFrame<double>.coord.pos);
      operator<<(pCVar2,&((local_208._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.rot);
      if (dump_vel) {
        pCVar2 = operator<<(&local_1c8,
                            &((local_208._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>.
                             coord_dt.pos);
        ChFrameMoving<double>::GetWvel_loc
                  ((ChVector<double> *)&local_1e8,
                   &((local_208._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>);
        operator<<(pCVar2,(ChVector<double> *)&local_1e8);
        p_Var3 = local_1f0;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_1c8.m_ss);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
    p_Var4 = p_Var4 + 1;
  } while( true );
}

Assistant:

void WriteBodies(ChSystem* system,
                 const std::string& filename,
                 bool active_only,
                 bool dump_vel,
                 const std::string& delim) {
    CSV_writer csv(delim);

    for (auto body : system->Get_bodylist()) {
        if (active_only && !body->IsActive())
            continue;
        csv << body->GetPos() << body->GetRot();
        if (dump_vel)
            csv << body->GetPos_dt() << body->GetWvel_loc();
        csv << std::endl;
    }

    csv.write_to_file(filename);
}